

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestMutualRecursionA::Clear(TestMutualRecursionA *this)

{
  TestMutualRecursionB *this_00;
  TestMutualRecursionA_SubGroup *this_01;
  char *pcVar1;
  anon_union_48_1_493b367e_for_TestMutualRecursionA_3 aVar2;
  int line;
  LogMessageFatal local_20;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestMutualRecursionA_SubGroupR>>
            (&(this->field_0)._impl_.subgroupr_.super_RepeatedPtrFieldBase);
  aVar2 = this->field_0;
  if (((undefined1  [48])aVar2 & (undefined1  [48])0x3) != (undefined1  [48])0x0) {
    if (((undefined1  [48])aVar2 & (undefined1  [48])0x1) != (undefined1  [48])0x0) {
      this_00 = (this->field_0)._impl_.bb_;
      if (this_00 == (TestMutualRecursionB *)0x0) {
        pcVar1 = "from._impl_.bb_ != nullptr";
        line = 0x5abe;
        goto LAB_00a191cb;
      }
      TestMutualRecursionB::Clear(this_00);
    }
    if (((undefined1  [48])aVar2 & (undefined1  [48])0x2) != (undefined1  [48])0x0) {
      this_01 = (this->field_0)._impl_.subgroup_;
      if (this_01 == (TestMutualRecursionA_SubGroup *)0x0) {
        pcVar1 = "from._impl_.subgroup_ != nullptr";
        line = 0x5ac2;
LAB_00a191cb:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.cc"
                   ,line,pcVar1 + 5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      TestMutualRecursionA_SubGroup::Clear(this_01);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestMutualRecursionA::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestMutualRecursionA)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.subgroupr_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.bb_ != nullptr);
      _impl_.bb_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.subgroup_ != nullptr);
      _impl_.subgroup_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}